

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

bool __thiscall soplex::SPxSteepPR<double>::isConsistent(SPxSteepPR<double> *this)

{
  SPxSteepPR<double> *this_local;
  
  return true;
}

Assistant:

bool SPxSteepPR<R>::isConsistent() const
{
#ifdef ENABLE_CONSISTENCY_CHECKS
   VectorBase<R>& w = this->thesolver->weights;
   VectorBase<R>& coW = this->thesolver->coWeights;

   if(this->thesolver != nullptr && this->thesolver->type() == SPxSolverBase<R>::LEAVE
         && setup == EXACT)
   {
      int i;
      SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());
      R x;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
         x = coW[i] - tmp.length2();

         if(x > this->thesolver->leavetol() || -x > this->thesolver->leavetol())
         {
            SPX_MSG_ERROR(std::cerr << "ESTEEP03 x[" << i << "] = " << x << std::endl;)
         }
      }
   }

   if(this->thesolver != nullptr && this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      int i;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         if(coW[i] < this->thesolver->epsilon())
            return SPX_MSG_INCONSISTENT("SPxSteepPR");
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         if(w[i] < this->thesolver->epsilon())
            return SPX_MSG_INCONSISTENT("SPxSteepPR");
      }
   }

#endif

   return true;
}